

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::MapKeySorter::MapKeyComparator::operator()
          (MapKeyComparator *this,MapKey *a,MapKey *b)

{
  bool bVar1;
  bool bVar2;
  CppType CVar3;
  CppType CVar4;
  int32 iVar5;
  int32 iVar6;
  uint32 uVar7;
  uint32 uVar8;
  LogMessage *pLVar9;
  string *psVar10;
  byte extraout_var;
  int64 iVar11;
  int64 iVar12;
  uint64 uVar13;
  uint64 uVar14;
  LogFinisher local_59;
  LogMessage local_58;
  
  CVar3 = MapKey::type(a);
  CVar4 = MapKey::type(b);
  if (CVar3 != CVar4) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x399);
    pLVar9 = LogMessage::operator<<(&local_58,"CHECK failed: a.type() == b.type(): ");
    LogFinisher::operator=(&local_59,pLVar9);
    LogMessage::~LogMessage(&local_58);
  }
  CVar3 = MapKey::type(a);
  switch(CVar3) {
  case CPPTYPE_INT32:
    iVar5 = MapKey::GetInt32Value(a);
    iVar6 = MapKey::GetInt32Value(b);
    bVar1 = SBORROW4(iVar5,iVar6);
    bVar2 = iVar5 - iVar6 < 0;
    goto LAB_005cf668;
  case CPPTYPE_INT64:
    iVar11 = MapKey::GetInt64Value(a);
    iVar12 = MapKey::GetInt64Value(b);
    bVar1 = SBORROW8(iVar11,iVar12);
    bVar2 = iVar11 - iVar12 < 0;
LAB_005cf668:
    bVar2 = bVar1 != bVar2;
    break;
  case CPPTYPE_UINT32:
    uVar7 = MapKey::GetUInt32Value(a);
    uVar8 = MapKey::GetUInt32Value(b);
    bVar2 = uVar7 < uVar8;
    break;
  case CPPTYPE_UINT64:
    uVar13 = MapKey::GetUInt64Value(a);
    uVar14 = MapKey::GetUInt64Value(b);
    bVar2 = uVar13 < uVar14;
    break;
  default:
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x3a8);
    pLVar9 = LogMessage::operator<<(&local_58,"Invalid key for map field.");
    LogFinisher::operator=(&local_59,pLVar9);
    LogMessage::~LogMessage(&local_58);
    bVar2 = true;
    break;
  case CPPTYPE_BOOL:
    bVar1 = MapKey::GetBoolValue(a);
    bVar2 = MapKey::GetBoolValue(b);
    bVar2 = !bVar1 && bVar2;
    break;
  case CPPTYPE_STRING:
    psVar10 = MapKey::GetStringValue_abi_cxx11_(a);
    MapKey::GetStringValue_abi_cxx11_(b);
    std::__cxx11::string::compare((string *)psVar10);
    bVar2 = (bool)(extraout_var >> 7);
  }
  return bVar2;
}

Assistant:

bool operator()(const MapKey& a, const MapKey& b) const {
      GOOGLE_DCHECK(a.type() == b.type());
      switch (a.type()) {
#define CASE_TYPE(CppType, CamelCppType)                                \
  case FieldDescriptor::CPPTYPE_##CppType: {                            \
    return a.Get##CamelCppType##Value() < b.Get##CamelCppType##Value(); \
  }
        CASE_TYPE(STRING, String)
        CASE_TYPE(INT64, Int64)
        CASE_TYPE(INT32, Int32)
        CASE_TYPE(UINT64, UInt64)
        CASE_TYPE(UINT32, UInt32)
        CASE_TYPE(BOOL, Bool)
#undef CASE_TYPE

        default:
          GOOGLE_LOG(DFATAL) << "Invalid key for map field.";
          return true;
      }
    }